

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncError UTF8ToUTF16BE(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  uint local_78;
  int local_74;
  uint min;
  int len;
  int i;
  int ret;
  uint d;
  uint c;
  uchar *outend;
  uchar *outstart;
  uchar *inend;
  uchar *instart;
  int flush_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  void *vctxt_local;
  
  len = -3;
  if (((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) {
    vctxt_local._4_4_ = XML_ENC_ERR_INTERNAL;
  }
  else if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    vctxt_local._4_4_ = XML_ENC_ERR_SUCCESS;
  }
  else {
    iVar1 = *inlen;
    piVar5 = (int *)(out + (int)(*outlen & 0xfffffffe));
    inlen_local = (int *)in;
    outlen_local = (int *)out;
    while( true ) {
      if (in + iVar1 <= inlen_local) break;
      iVar2 = *inlen_local;
      uVar3 = (uint)(byte)iVar2;
      if (uVar3 < 0x80) {
        if (piVar5 <= outlen_local) goto LAB_0012e54c;
        *(undefined1 *)outlen_local = 0;
        *(byte *)((long)outlen_local + 1) = (byte)iVar2;
        inlen_local = (int *)((long)inlen_local + 1);
        outlen_local = (int *)((long)outlen_local + 2);
      }
      else {
        if (uVar3 < 0xe0) {
          if (uVar3 < 0xc2) {
            len = -2;
            goto LAB_0012e54c;
          }
          ret = uVar3 & 0x1f;
          local_74 = 2;
          local_78 = 0x80;
        }
        else {
          if (uVar3 < 0xf0) {
            local_74 = 3;
            local_78 = 0x800;
          }
          else {
            local_74 = 4;
            local_78 = 0x10000;
          }
          ret = uVar3 & 0xf;
        }
        if ((long)(in + iVar1) - (long)inlen_local < (long)local_74) break;
        for (min = 1; (int)min < local_74; min = min + 1) {
          if ((*(byte *)((long)inlen_local + (long)(int)min) & 0xc0) != 0x80) {
            len = -2;
            goto LAB_0012e54c;
          }
          ret = ret << 6 | *(byte *)((long)inlen_local + (long)(int)min) & 0x3f;
        }
        if ((((uint)ret < local_78) || ((0xd7ff < (uint)ret && ((uint)ret < 0xe000)))) ||
           (0x10ffff < (uint)ret)) {
          len = -2;
          goto LAB_0012e54c;
        }
        if ((uint)ret < 0x10000) {
          if (piVar5 <= outlen_local) goto LAB_0012e54c;
          *(char *)outlen_local = (char)((uint)ret >> 8);
          *(char *)((long)outlen_local + 1) = (char)ret;
          outlen_local = (int *)((long)outlen_local + 2);
        }
        else {
          if ((long)piVar5 - (long)outlen_local < 4) goto LAB_0012e54c;
          uVar3 = ret - 0x10000U & 0x3ff;
          uVar4 = ret - 0x10000U >> 10;
          *(byte *)outlen_local = (byte)(uVar4 >> 8) | 0xd8;
          *(char *)((long)outlen_local + 1) = (char)uVar4;
          *(byte *)((long)outlen_local + 2) = (byte)(uVar3 >> 8) | 0xdc;
          *(char *)((long)outlen_local + 3) = (char)uVar3;
          outlen_local = outlen_local + 1;
        }
        inlen_local = (int *)((long)inlen_local + (long)local_74);
      }
    }
    len = (int)outlen_local - (int)out;
LAB_0012e54c:
    *outlen = (int)outlen_local - (int)out;
    *inlen = (int)inlen_local - (int)in;
    vctxt_local._4_4_ = len;
  }
  return vctxt_local._4_4_;
}

Assistant:

static xmlCharEncError
UTF8ToUTF16BE(void *vctxt ATTRIBUTE_UNUSED,
              unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              int flush ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend;
    unsigned char *outstart = out;
    unsigned char *outend;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    /* UTF-16BE has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + *inlen;
    outend = out + (*outlen & ~1);
    while (in < inend) {
        c = in[0];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = 0;
            out[1] = c;
            in += 1;
            out += 2;
        } else {
            int i, len;
            unsigned min;

            if (c < 0xE0) {
                if (c < 0xC2) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c &= 0x1F;
                len = 2;
                min = 0x80;
            } else if (c < 0xF0) {
                c &= 0x0F;
                len = 3;
                min = 0x800;
            } else {
                c &= 0x0F;
                len = 4;
                min = 0x10000;
            }

            if (inend - in < len)
                break;

            for (i = 1; i < len; i++) {
                if ((in[i] & 0xC0) != 0x80) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c = (c << 6) | (in[i] & 0x3F);
            }

            if ((c < min) ||
                ((c >= 0xD800) && (c <= 0xDFFF)) ||
                (c > 0x10FFFF)) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }

            if (c < 0x10000) {
                if (out >= outend)
                    goto done;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out += 2;
            } else {
                if (outend - out < 4)
                    goto done;
                c -= 0x10000;
                d = (c & 0x03FF) | 0xDC00;
                c = (c >> 10)    | 0xD800;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out[2] = d >> 8;
                out[3] = d & 0xFF;
                out += 4;
            }

            in += len;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}